

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

int ndn_data_parse_encrypted_content
              (ndn_data_t *data,uint8_t *payload_value,uint32_t *payload_used_size,
              ndn_name_t *key_name)

{
  uint32_t aes_key_id;
  undefined1 local_48 [8];
  ndn_decoder_t decoder;
  int ret_val;
  ndn_name_t *key_name_local;
  uint32_t *payload_used_size_local;
  uint8_t *payload_value_local;
  ndn_data_t *data_local;
  
  decoder.offset = 0xffffffff;
  decoder_init((ndn_decoder_t *)local_48,data->content_value,data->content_size);
  decoder.offset = ndn_name_tlv_decode((ndn_decoder_t *)local_48,key_name);
  data_local._4_4_ = decoder.offset;
  if (decoder.offset == 0) {
    aes_key_id = key_id_from_key_name(key_name);
    data_local._4_4_ =
         ndn_parse_encrypted_payload
                   ((uint8_t *)((long)local_48 + (ulong)decoder.input_value._4_4_),
                    (int)decoder.input_value - decoder.input_value._4_4_,payload_value,
                    payload_used_size,aes_key_id);
    if (data_local._4_4_ == 0) {
      data_local._4_4_ = 0;
    }
  }
  return data_local._4_4_;
}

Assistant:

int
ndn_data_parse_encrypted_content(const ndn_data_t* data, uint8_t* payload_value, uint32_t* payload_used_size,
                                 ndn_name_t* key_name)
{
  int ret_val = -1;
  ndn_decoder_t decoder;
  decoder_init(&decoder, data->content_value, data->content_size);

  // type: TLV_NAME
  ret_val = ndn_name_tlv_decode(&decoder, key_name);
  if (ret_val != NDN_SUCCESS) return ret_val;

  ret_val = ndn_parse_encrypted_payload(decoder.input_value + decoder.offset, decoder.input_size - decoder.offset,
                                        payload_value, payload_used_size, key_id_from_key_name(key_name));
  if (ret_val != NDN_SUCCESS) return ret_val;
  return 0;
}